

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_piecewise_merge_join.cpp
# Opt level: O2

void __thiscall
duckdb::PiecewiseJoinScanState::~PiecewiseJoinScanState(PiecewiseJoinScanState *this)

{
  ~PiecewiseJoinScanState(this);
  operator_delete(this);
  return;
}

Assistant:

explicit PiecewiseJoinScanState(const PhysicalPiecewiseMergeJoin &op) : op(op), right_outer_position(0) {
	}